

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O3

TiXmlNode * __thiscall
despot::util::tinyxml::TiXmlNode::Identify(TiXmlNode *this,char *p,TiXmlEncoding encoding)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  TiXmlElement *this_00;
  undefined *puVar5;
  TiXmlEncoding in_ECX;
  
  pcVar4 = TiXmlBase::SkipWhiteSpace(p,encoding);
  if ((pcVar4 != (char *)0x0) && (*pcVar4 == '<')) {
    GetDocument(this);
    pcVar4 = TiXmlBase::SkipWhiteSpace(pcVar4,encoding);
    if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
      bVar2 = TiXmlBase::StringEqual(pcVar4,"<?xml",true,in_ECX);
      if (bVar2) {
        this_00 = (TiXmlElement *)operator_new(0x68);
        TiXmlNode((TiXmlNode *)this_00,DECLARATION);
        (this_00->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase =
             (_func_int **)&PTR__TiXmlDeclaration_00190620;
        (this_00->attributeSet).sentinel.super_TiXmlBase._vptr_TiXmlBase =
             (_func_int **)&TiXmlString::nullrep_;
        *(undefined8 **)&(this_00->attributeSet).sentinel.super_TiXmlBase.location.row =
             &TiXmlString::nullrep_;
        (this_00->attributeSet).sentinel.super_TiXmlBase.userData = &TiXmlString::nullrep_;
      }
      else {
        bVar2 = TiXmlBase::StringEqual(pcVar4,"<!--",false,in_ECX);
        if (bVar2) {
          this_00 = (TiXmlElement *)operator_new(0x50);
          TiXmlNode((TiXmlNode *)this_00,COMMENT);
          puVar5 = &TiXmlComment::vtable;
        }
        else {
          bVar2 = TiXmlBase::StringEqual(pcVar4,"<![CDATA[",false,in_ECX);
          if (bVar2) {
            this_00 = (TiXmlElement *)operator_new(0x58);
            TiXmlText::TiXmlText((TiXmlText *)this_00,"");
            *(bool *)&(this_00->attributeSet).sentinel.super_TiXmlBase._vptr_TiXmlBase = true;
            goto LAB_00172545;
          }
          bVar2 = TiXmlBase::StringEqual(pcVar4,"<!",false,in_ECX);
          if (bVar2) {
            this_00 = (TiXmlElement *)operator_new(0x50);
            TiXmlNode((TiXmlNode *)this_00,UNKNOWN);
          }
          else {
            bVar1 = pcVar4[1];
            if (((0x7e < bVar1) || (iVar3 = isalpha((uint)bVar1), bVar1 == 0x5f)) || (iVar3 != 0)) {
              this_00 = (TiXmlElement *)operator_new(0x90);
              TiXmlElement::TiXmlElement(this_00,"");
              goto LAB_00172545;
            }
            this_00 = (TiXmlElement *)operator_new(0x50);
            TiXmlNode((TiXmlNode *)this_00,UNKNOWN);
          }
          puVar5 = &TiXmlUnknown::vtable;
        }
        (this_00->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase = (_func_int **)(puVar5 + 0x10);
      }
LAB_00172545:
      (this_00->super_TiXmlNode).parent = this;
      return &this_00->super_TiXmlNode;
    }
  }
  return (TiXmlNode *)0x0;
}

Assistant:

TiXmlNode* TiXmlNode::Identify(const char* p, TiXmlEncoding encoding) {
	TiXmlNode* returnNode = 0;

	p = SkipWhiteSpace(p, encoding);
	if (!p || !*p || *p != '<') {
		return 0;
	}

	TiXmlDocument* doc = GetDocument();
	p = SkipWhiteSpace(p, encoding);

	if (!p || !*p) {
		return 0;
	}

	// What is this thing?
	// - Elements start with a letter or underscore, but xml is reserved.
	// - Comments: <!--
	// - Decleration: <?xml
	// - Everthing else is unknown to tinyxml.
	//

	const char* xmlHeader = { "<?xml" };
	const char* commentHeader = { "<!--" };
	const char* dtdHeader = { "<!" };
	const char* cdataHeader = { "<![CDATA[" };

	if (StringEqual(p, xmlHeader, true, encoding)) {
#ifdef DEBUG_PARSER
		TIXML_LOG( "XML parsing Declaration\n" );
#endif
		returnNode = new TiXmlDeclaration();
	} else if (StringEqual(p, commentHeader, false, encoding)) {
#ifdef DEBUG_PARSER
		TIXML_LOG( "XML parsing Comment\n" );
#endif
		returnNode = new TiXmlComment();
	} else if (StringEqual(p, cdataHeader, false, encoding)) {
#ifdef DEBUG_PARSER
		TIXML_LOG( "XML parsing CDATA\n" );
#endif
		TiXmlText* text = new TiXmlText("");
		text->SetCDATA(true);
		returnNode = text;
	} else if (StringEqual(p, dtdHeader, false, encoding)) {
#ifdef DEBUG_PARSER
		TIXML_LOG( "XML parsing Unknown(1)\n" );
#endif
		returnNode = new TiXmlUnknown();
	} else if (IsAlpha(*(p + 1), encoding) || *(p + 1) == '_') {
#ifdef DEBUG_PARSER
		TIXML_LOG( "XML parsing Element\n" );
#endif
		returnNode = new TiXmlElement("");
	} else {
#ifdef DEBUG_PARSER
		TIXML_LOG( "XML parsing Unknown(2)\n" );
#endif
		returnNode = new TiXmlUnknown();
	}

	if (returnNode) {
		// Set the parent, so it can report errors
		returnNode->parent = this;
	} else {
		if (doc)
			doc->SetError(TIXML_ERROR_OUT_OF_MEMORY, 0, 0,
				TIXML_ENCODING_UNKNOWN);
	}
	return returnNode;
}